

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chop.cpp
# Opt level: O2

handle_t handlegraph::algorithms::concat_nodes
                   (MutablePathDeletableHandleGraph *graph,
                   vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *nodes)

{
  handle_t *a;
  handle_t *phVar1;
  long lVar2;
  long lVar3;
  pointer ptVar4;
  bool bVar5;
  handle_t hVar6;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2;
  __node_base *p_Var7;
  handle_t *n;
  pointer phVar8;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2_1;
  pointer ptVar9;
  handle_t *n_1;
  __node_base *p_Var10;
  pointer phVar11;
  __node_base *p_Var12;
  initializer_list<handlegraph::handle_t> __l;
  allocator_type local_271;
  handle_t new_node;
  handle_t local_258;
  _Any_data local_250;
  handle_t *local_240;
  MutablePathDeletableHandleGraph *local_238;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  right_neighbors;
  vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
  ranges_to_rewrite;
  _Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> local_1d0;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  left_neighbors;
  
  a = (nodes->super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
      _M_impl.super__Vector_impl_data._M_start;
  phVar1 = (nodes->super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((a != phVar1) && (bVar5 = operator!=(a,phVar1 + -1), bVar5)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&left_neighbors);
    phVar11 = (nodes->
              super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    p_Var12 = &left_neighbors._M_h._M_before_begin;
    for (phVar8 = (nodes->
                  super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>)
                  ._M_impl.super__Vector_impl_data._M_start; phVar8 != phVar11; phVar8 = phVar8 + 1)
    {
      (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x40))
                ((string *)&right_neighbors,&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),
                 phVar8);
      std::operator<<((ostream *)p_Var12,(string *)&right_neighbors);
      std::__cxx11::string::~string((string *)&right_neighbors);
    }
    lVar2 = *(long *)(*(long *)graph + -0x1d0);
    std::__cxx11::stringbuf::str();
    new_node.data =
         (char  [8])
         (**(code **)(*(long *)(&graph->field_0x0 + lVar2) + 0xa0))
                   (&graph->field_0x0 + lVar2,&right_neighbors);
    std::__cxx11::string::~string((string *)&right_neighbors);
    std::__cxx11::stringstream::~stringstream((stringstream *)&left_neighbors);
    left_neighbors._M_h._M_buckets = &left_neighbors._M_h._M_single_bucket;
    left_neighbors._M_h._M_bucket_count = 1;
    left_neighbors._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    left_neighbors._M_h._M_element_count = 0;
    left_neighbors._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    left_neighbors._M_h._M_rehash_policy._M_next_resize = 0;
    left_neighbors._M_h._M_single_bucket = (__node_base_ptr)0x0;
    right_neighbors._M_h._M_buckets = (__buckets_ptr)&local_250;
    right_neighbors._M_h._M_bucket_count = 0;
    right_neighbors._M_h._M_element_count =
         (size_type)
         std::
         _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
         ::_M_invoke;
    right_neighbors._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         std::
         _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
         ::_M_manager;
    local_250._M_unused._M_object = nodes;
    local_250._8_8_ = (stringstream *)&left_neighbors;
    local_240 = &new_node;
    local_238 = graph;
    (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x90))
              (&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),
               (nodes->
               super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
               _M_impl.super__Vector_impl_data._M_start,1,&right_neighbors);
    std::_Function_base::~_Function_base((_Function_base *)&right_neighbors);
    right_neighbors._M_h._M_buckets = &right_neighbors._M_h._M_single_bucket;
    right_neighbors._M_h._M_bucket_count = 1;
    right_neighbors._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    right_neighbors._M_h._M_element_count = 0;
    right_neighbors._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    right_neighbors._M_h._M_rehash_policy._M_next_resize = 0;
    right_neighbors._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_250._8_8_ = 0;
    local_238 = (MutablePathDeletableHandleGraph *)
                std::
                _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
                ::_M_invoke;
    local_240 = (handle_t *)
                std::
                _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
                ::_M_manager;
    local_250._M_unused._M_object = &ranges_to_rewrite;
    ranges_to_rewrite.
    super__Vector_base<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)nodes;
    ranges_to_rewrite.
    super__Vector_base<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)graph;
    ranges_to_rewrite.
    super__Vector_base<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&right_neighbors;
    (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x90))
              (&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),
               (nodes->
               super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
               _M_impl.super__Vector_impl_data._M_finish + -1,0);
    p_Var10 = &right_neighbors._M_h._M_before_begin;
    std::_Function_base::~_Function_base((_Function_base *)&local_250);
    p_Var7 = p_Var12;
    while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
      (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1d0)) + 0xb0))
                (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1d0),p_Var7 + 1,&new_node);
    }
    p_Var7 = p_Var10;
    while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
      (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1d0)) + 0xb0))
                (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1d0),&new_node,p_Var7 + 1);
    }
    ranges_to_rewrite.
    super__Vector_base<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ranges_to_rewrite.
    super__Vector_base<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ranges_to_rewrite.
    super__Vector_base<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_250._M_unused._M_object = &local_1d0;
    local_250._8_8_ = 0;
    local_238 = (MutablePathDeletableHandleGraph *)
                std::
                _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
                ::_M_invoke;
    local_240 = (handle_t *)
                std::
                _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
                ::_M_manager;
    local_1d0._M_impl.super__Vector_impl_data._M_start = (pointer)graph;
    local_1d0._M_impl.super__Vector_impl_data._M_finish = (pointer)nodes;
    local_1d0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&ranges_to_rewrite;
    (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x168)) + 0x130))
              (&graph->field_0x0 + *(long *)(*(long *)graph + -0x168),
               (nodes->
               super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
               _M_impl.super__Vector_impl_data._M_start);
    std::_Function_base::~_Function_base((_Function_base *)&local_250);
    ptVar4 = ranges_to_rewrite.
             super__Vector_base<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ptVar9 = ranges_to_rewrite.
                  super__Vector_base<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ptVar9 != ptVar4; ptVar9 = ptVar9 + 1)
    {
      lVar2 = *(long *)(*(long *)graph + -0x1c8);
      hVar6.data = new_node.data;
      if ((ptVar9->
          super__Tuple_impl<0UL,_handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>).
          super__Tuple_impl<1UL,_handlegraph::step_handle_t,_bool>.super__Tuple_impl<2UL,_bool>.
          super__Head_base<2UL,_bool,_false>._M_head_impl == true) {
        lVar3 = *(long *)(*(long *)graph + -0xb0);
        hVar6.data = (char  [8])
                     (**(code **)(*(long *)(&graph->field_0x0 + lVar3) + 0x30))
                               (&graph->field_0x0 + lVar3,&new_node);
      }
      __l._M_len = 1;
      __l._M_array = &local_258;
      local_258.data = hVar6.data;
      std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
                ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)&local_1d0
                 ,__l,&local_271);
      (**(code **)(*(long *)(&graph->field_0x0 + lVar2) + 0x188))
                (&local_250,&graph->field_0x0 + lVar2,
                 &(ptVar9->
                  super__Tuple_impl<0UL,_handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>
                  ).super__Head_base<0UL,_handlegraph::step_handle_t,_false>,
                 &(ptVar9->
                  super__Tuple_impl<0UL,_handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>
                  ).super__Tuple_impl<1UL,_handlegraph::step_handle_t,_bool>.
                  super__Head_base<1UL,_handlegraph::step_handle_t,_false>,&local_1d0);
      std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::
      ~_Vector_base(&local_1d0);
    }
    std::
    _Vector_base<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
    ::~_Vector_base(&ranges_to_rewrite.
                     super__Vector_base<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
                   );
    while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
      (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0)) + 0x108))
                (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0),p_Var12 + 1,
                 (nodes->
                 super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
                 _M_impl.super__Vector_impl_data._M_start);
    }
    while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
      (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0)) + 0x108))
                (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0),
                 (nodes->
                 super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
                 _M_impl.super__Vector_impl_data._M_finish + -1,p_Var10 + 1);
    }
    phVar8 = (nodes->
             super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
             _M_impl.super__Vector_impl_data._M_start;
    while (phVar11 = phVar8 + 1,
          phVar11 !=
          (nodes->super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>)
          ._M_impl.super__Vector_impl_data._M_finish) {
      (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0)) + 0x108))
                (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0),phVar8,phVar11);
      phVar8 = phVar11;
    }
    for (phVar11 = (nodes->
                   super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                   )._M_impl.super__Vector_impl_data._M_start; phVar8 + 1 != phVar11;
        phVar11 = phVar11 + 1) {
      (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0)) + 0xf8))
                (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0),phVar11);
    }
    std::
    _Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&right_neighbors._M_h);
    std::
    _Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&left_neighbors._M_h);
    return (handle_t)new_node.data;
  }
  __assert_fail("!nodes.empty() && nodes.front() != nodes.back()",
                "/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/chop.cpp"
                ,0x24,
                "handle_t handlegraph::algorithms::concat_nodes(MutablePathDeletableHandleGraph &, const std::vector<handle_t> &)"
               );
}

Assistant:

handle_t concat_nodes(MutablePathDeletableHandleGraph& graph, const std::vector<handle_t>& nodes) {
    
    // Make sure we have at least 2 nodes
    assert(!nodes.empty() && nodes.front() != nodes.back());
    
    // We also require no edges enter or leave the run of nodes, but we can't check that now.
    
    // Make the new node
    handle_t new_node;
    {
        std::stringstream ss;
        for (auto& n : nodes) {
            ss << graph.get_sequence(n);
        }
        
        new_node = graph.create_handle(ss.str());
    }
    
#ifdef debug
    std::cerr << "Concatenating ";
    for (auto& n : nodes) {
        std::cerr << graph.get_id(n) << (graph.get_is_reverse(n) ? "-" : "+") << " ";
    }
    std::cerr << "into " << graph.get_id(new_node) << "+" << std::endl;
#endif
    
    // We should be able to rely on our handle graph to deduplicate edges, but see https://github.com/vgteam/libbdsg/issues/39
    // So we deduplicate ourselves.
    
    // Find all the neighbors. Make sure to translate edges to the other end of
    // the run, or self loops.
    std::unordered_set<handle_t> left_neighbors;
    graph.follow_edges(nodes.front(), true, [&](const handle_t& left_neighbor) {
        if (left_neighbor == nodes.back()) {
            // Loop back to the end
            left_neighbors.insert(new_node);
        } else if (left_neighbor == graph.flip(nodes.front())) {
            // Loop back to the front
            left_neighbors.insert(graph.flip(new_node));
        } else {
            // Normal edge
            left_neighbors.insert(left_neighbor);
        }
    });
    
    std::unordered_set<handle_t> right_neighbors;
    graph.follow_edges(nodes.back(), false, [&](const handle_t& right_neighbor) {
        if (right_neighbor == nodes.front()) {
            // Loop back to the front.
            // We will have seen it from the other side, so ignore it here.
        } else if (right_neighbor == graph.flip(nodes.back())) {
            // Loop back to the end
            right_neighbors.insert(graph.flip(new_node));
        } else {
            // Normal edge
            right_neighbors.insert(right_neighbor);
        }
    });
    
    // Make all the edges, now that we can't interfere with edge listing
    for (auto& n : left_neighbors) {
#ifdef debug
        std::cerr << "Creating edge " << graph.get_id(n) << (graph.get_is_reverse(n) ? "-" : "+") << " -> "
        <<  graph.get_id(new_node) << (graph.get_is_reverse(new_node) ? "-" : "+") << std::endl;
#endif
        graph.create_edge(n, new_node);
    }
    for (auto& n : right_neighbors) {
        
#ifdef debug
        std::cerr << "Creating edge " << graph.get_id(new_node) << (graph.get_is_reverse(new_node) ? "-" : "+") << " -> "
        <<  graph.get_id(n) << (graph.get_is_reverse(n) ? "-" : "+") << std::endl;
#endif
        
        graph.create_edge(new_node, n);
    }
    
    {
        // Collect the first and last visits along paths. TODO: this requires
        // walking each path all the way through.
        //
        // This contains the first and last handles in path orientation, and a flag
        // for if the path runs along the reverse strand of our run of nodes.
        std::vector<std::tuple<step_handle_t, step_handle_t, bool>> ranges_to_rewrite;
        
        graph.for_each_step_on_handle(nodes.front(), [&](const step_handle_t& front_step) {
            auto path = graph.get_path_handle_of_step(front_step);
#ifdef debug
            std::cerr << "Consider path " << graph.get_path_name(path) << std::endl;
#endif
            
            // If we don't get the same oriented node as where this step is
            // stepping, we must be stepping on the other orientation.
            bool runs_reverse = (graph.get_handle_of_step(front_step) != nodes.front());
            
            step_handle_t back_step = front_step;
            
            while (graph.get_handle_of_step(back_step) !=
                   (runs_reverse ? graph.flip(nodes.back()) : nodes.back())) {
                // Until we find the step on the path that visits the last node in our run.
                // Go along the path towards where our last node should be, in our forward orientation.
                back_step = runs_reverse ? graph.get_previous_step(back_step) : graph.get_next_step(back_step);
            }
            
            // Now we can record the range to rewrite
            // Make sure to put it into path-forward order
            if (runs_reverse) {
#ifdef debug
                std::cerr << "\tGoing to rewrite between " << graph.get_id(graph.get_handle_of_step(front_step)) << " and " << graph.get_id(graph.get_handle_of_step(back_step)) << " backward" << std::endl;
#endif
                ranges_to_rewrite.emplace_back(back_step, front_step, true);
            } else {
                
#ifdef debug
                std::cerr << "\tGoing to rewrite between " << graph.get_id(graph.get_handle_of_step(front_step)) << " and " << graph.get_id(graph.get_handle_of_step(back_step)) << std::endl;
#endif
                ranges_to_rewrite.emplace_back(front_step, back_step, false);
            }
        });
        
        uint64_t i = 0;
        for (auto& range : ranges_to_rewrite) {
            // Rewrite each range to visit the new node in the appropriate orientation instead of whatever it did before
            // Make sure to advance the end of the range because rewrite is end-exclusive (to allow insert).
            graph.rewrite_segment(std::get<0>(range), std::get<1>(range),
                                  {std::get<2>(range) ? graph.flip(new_node) : new_node});
        }
    }
    
    // Destroy all the old edges
    // We know they only exist to the left and right neighbors, and along the run
    for (auto& n : left_neighbors) {
        graph.destroy_edge(n, nodes.front());
    }
    for (auto& n : right_neighbors) {
        graph.destroy_edge(nodes.back(), n);
    }
    auto it = nodes.begin();
    auto next_it = it;
    ++next_it;
    while (next_it != nodes.end()) {
        graph.destroy_edge(*it, *next_it);
        it = next_it;
        ++next_it;
    }
    
    for (auto& n : nodes) {
        // Destroy all the old nodes
#ifdef debug
        std::cerr << "Destroying node " << graph.get_id(n) << std::endl;
#endif
        graph.destroy_handle(n);
    }
    
    /*
     #ifdef debug
     std::cerr << "Paths after concat: " << std::endl;
     graph.for_each_path_handle([&](const path_handle_t p) {
     std::cerr << graph.get_path_name(p) << ": ";
     for (auto h : graph.scan_path(p)) {
     std::cerr << graph.get_id(h) << (graph.get_is_reverse(h) ? '-' : '+') << " ";
     }
     std::cerr << std::endl;
     });
     #endif
     */
    
    // Return the new handle we merged to.
    return new_node;
}